

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3CachedOnePass(int iters,char *regexp,StringPiece *text)

{
  Prog *pPVar1;
  bool bVar2;
  ostream *poVar3;
  StringPiece *local_6d8;
  LogMessage local_6a0;
  int local_51c;
  undefined1 local_518 [4];
  int i;
  StringPiece sp [4];
  LogMessage local_4d0;
  LogMessage local_350;
  Prog *local_1d0;
  Prog *prog;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re = (Regexp *)text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  StringPiece::StringPiece(&local_38,regexp);
  local_28 = Regexp::Parse(&local_38,LikePerl,(RegexpStatus *)0x0);
  if (local_28 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x46f);
    poVar3 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar3,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
  local_1d0 = Regexp::CompileToProg(local_28,0);
  if (local_1d0 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x471);
    poVar3 = LogMessage::stream(&local_350);
    std::operator<<(poVar3,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_350);
  }
  bVar2 = Prog::IsOnePass(local_1d0);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x472);
    poVar3 = LogMessage::stream(&local_4d0);
    std::operator<<(poVar3,"Check failed: prog->IsOnePass()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4d0);
  }
  local_6d8 = (StringPiece *)local_518;
  do {
    StringPiece::StringPiece(local_6d8);
    local_6d8 = local_6d8 + 1;
  } while (local_6d8 != (StringPiece *)&sp[3].length_);
  for (local_51c = 0; pPVar1 = local_1d0, local_51c < regexp_local._4_4_; local_51c = local_51c + 1)
  {
    bVar2 = Prog::SearchOnePass(local_1d0,(StringPiece *)re,(StringPiece *)re,kAnchored,kFullMatch,
                                (StringPiece *)local_518,4);
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_6a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x475);
      poVar3 = LogMessage::stream(&local_6a0);
      std::operator<<(poVar3,
                      "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6a0);
    }
  }
  if (local_1d0 != (Prog *)0x0) {
    Prog::~Prog(local_1d0);
    operator_delete(pPVar1);
  }
  Regexp::Decref(local_28);
  return;
}

Assistant:

void Parse3CachedOnePass(int iters, const char* regexp, const StringPiece& text) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  CHECK(prog->IsOnePass());
  StringPiece sp[4];  // 4 because sp[0] is whole match.
  for (int i = 0; i < iters; i++)
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
  delete prog;
  re->Decref();
}